

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QString>::
emplace<QStringBuilder<QStringBuilder<QString_const&,char16_t>,QString>>
          (QMovableArrayOps<QString> *this,qsizetype i,
          QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString> *args)

{
  qsizetype *pqVar1;
  QString **ppQVar2;
  QString *pQVar3;
  Data *pDVar4;
  QString *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004aff67:
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString>::convertTo<QString>
              (&local_48,args);
    bVar6 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size != 0;
    QArrayDataPointer<QString>::detachAndGrow
              ((QArrayDataPointer<QString> *)this,(uint)(i == 0 && bVar6),1,(QString **)0x0,
               (QArrayDataPointer<QString> *)0x0);
    pQVar5 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
    if (i == 0 && bVar6) {
      pQVar5[-1].d.d = local_48.d.d;
      pQVar5[-1].d.ptr = local_48.d.ptr;
      pQVar5[-1].d.size = local_48.d.size;
      (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr = pQVar5 + -1;
    }
    else {
      pQVar3 = pQVar5 + i;
      memmove(pQVar3 + 1,pQVar5 + i,
              ((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size - i) *
              0x18);
      (pQVar3->d).d = local_48.d.d;
      (pQVar3->d).ptr = local_48.d.ptr;
      (pQVar3->d).size = local_48.d.size;
    }
    local_48.d.size = 0;
    local_48.d.ptr = (char16_t *)0x0;
    local_48.d.d = (Data *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    if (((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size == i) &&
       (pQVar5 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr,
       (pDVar4->super_QArrayData).alloc - i !=
       ((long)((long)pQVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x5555555555555555)) {
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString>::convertTo<QString>
                (pQVar5 + i,args);
    }
    else {
      if ((i != 0) ||
         (pQVar5 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr,
         (QString *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pQVar5)) goto LAB_004aff67;
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString>::convertTo<QString>
                (pQVar5 + -1,args);
      ppQVar2 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
      *ppQVar2 = *ppQVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }